

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixGetTempname(int nBuf,char *zBuf)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *__s;
  char *pcVar5;
  stat buf;
  undefined1 local_c0 [24];
  uint local_a8;
  
  unixTempFileDir_azDirs = sqlite3_temp_directory;
  if (DAT_001b1a18 == (char *)0x0) {
    DAT_001b1a18 = getenv("SQLITE_TMPDIR");
  }
  if (DAT_001b1a20 == (char *)0x0) {
    DAT_001b1a20 = getenv("TMPDIR");
  }
  lVar4 = 0;
  pcVar5 = (char *)0x0;
  do {
    if (pcVar5 != (char *)0x0) {
      iVar1 = (*aSyscall[4].pCurrent)(pcVar5,local_c0);
      if ((iVar1 == 0) && ((local_a8 & 0xf000) == 0x4000)) {
        iVar1 = (*aSyscall[2].pCurrent)(pcVar5,7);
        if (iVar1 == 0) break;
      }
    }
    pcVar5 = *(char **)((long)&unixTempFileDir_azDirs + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x38);
  __s = ".";
  if (pcVar5 != (char *)0x0) {
    __s = pcVar5;
  }
  sVar3 = strlen(__s);
  iVar1 = 1;
  if (sVar3 + 0x19 < (ulong)(long)nBuf) {
    do {
      sqlite3_snprintf(nBuf + -0x12,zBuf,"%s/etilqs_",__s);
      sVar3 = strlen(zBuf);
      iVar1 = 0xf;
      sqlite3_randomness(0xf,zBuf + (sVar3 & 0xffffffff));
      do {
        iVar2 = (int)sVar3;
        zBuf[sVar3 & 0xffffffff] =
             "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"
             [(byte)zBuf[sVar3 & 0xffffffff] % 0x3e];
        sVar3 = (size_t)(iVar2 + 1);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      iVar1 = 0;
      zBuf[sVar3] = '\0';
      zBuf[iVar2 + 2] = '\0';
      iVar2 = (*aSyscall[2].pCurrent)(zBuf,0);
    } while (iVar2 == 0);
  }
  return iVar1;
}

Assistant:

static int unixGetTempname(int nBuf, char *zBuf){
  static const unsigned char zChars[] =
    "abcdefghijklmnopqrstuvwxyz"
    "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
    "0123456789";
  unsigned int i, j;
  const char *zDir;

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. 
  */
  SimulateIOError( return SQLITE_IOERR );

  zDir = unixTempFileDir();
  if( zDir==0 ) zDir = ".";

  /* Check that the output buffer is large enough for the temporary file 
  ** name. If it is not, return SQLITE_ERROR.
  */
  if( (strlen(zDir) + strlen(SQLITE_TEMP_FILE_PREFIX) + 18) >= (size_t)nBuf ){
    return SQLITE_ERROR;
  }

  do{
    sqlite3_snprintf(nBuf-18, zBuf, "%s/"SQLITE_TEMP_FILE_PREFIX, zDir);
    j = (int)strlen(zBuf);
    sqlite3_randomness(15, &zBuf[j]);
    for(i=0; i<15; i++, j++){
      zBuf[j] = (char)zChars[ ((unsigned char)zBuf[j])%(sizeof(zChars)-1) ];
    }
    zBuf[j] = 0;
    zBuf[j+1] = 0;
  }while( osAccess(zBuf,0)==0 );
  return SQLITE_OK;
}